

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O0

void __thiscall tf::Semaphore::_release(Semaphore *this,SmallVector<tf::Node_*,_2U> *dst)

{
  bool bVar1;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_RSI;
  long in_RDI;
  SmallVectorTemplateCommon<tf::Node_*,_void> *this_00;
  Node **unaff_retaddr;
  Node **in_stack_00000008;
  iterator in_stack_00000010;
  SmallVectorImpl<tf::Node_*> *in_stack_00000018;
  SmallVectorImpl<tf::Node_*> *in_stack_00000048;
  lock_guard<std::mutex> lock;
  unsigned_long *in_stack_00000178;
  char (*in_stack_00000180) [58];
  size_t in_stack_00000188;
  char *in_stack_00000190;
  mutex_type *in_stack_ffffffffffffff98;
  SmallVectorTemplateCommon<tf::Node_*,_void> *in_stack_ffffffffffffffa0;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (*(ulong *)(in_RDI + 0x28) <= *(ulong *)(in_RDI + 0x30)) {
    throw_re<char_const(&)[58],unsigned_long&>
              (in_stack_00000190,in_stack_00000188,in_stack_00000180,in_stack_00000178);
  }
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  bVar1 = SmallVectorBase::empty(&in_RSI->super_SmallVectorBase);
  if (bVar1) {
    SmallVectorImpl<tf::Node_*>::swap
              ((SmallVectorImpl<tf::Node_*> *)lock._M_device,in_stack_00000048);
  }
  else {
    SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffffa0);
    SmallVectorTemplateCommon<tf::Node_*,_void>::size(in_stack_ffffffffffffffa0);
    SmallVectorImpl<tf::Node_*>::reserve
              ((SmallVectorImpl<tf::Node_*> *)in_stack_ffffffffffffffa0,
               (size_type)in_stack_ffffffffffffff98);
    SmallVectorTemplateCommon<tf::Node_*,_void>::end(in_RSI);
    this_00 = (SmallVectorTemplateCommon<tf::Node_*,_void> *)(in_RDI + 0x38);
    SmallVectorTemplateCommon<tf::Node_*,_void>::begin(this_00);
    SmallVectorTemplateCommon<tf::Node_*,_void>::end(this_00);
    SmallVectorImpl<tf::Node*>::insert<tf::Node**>
              (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    SmallVectorImpl<tf::Node_*>::clear((SmallVectorImpl<tf::Node_*> *)in_RSI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x166f7b);
  return;
}

Assistant:

inline void Semaphore::_release(SmallVector<Node*>& dst) {

  std::lock_guard<std::mutex> lock(_mtx);

  if(_cur_value >= _max_value) {
    TF_THROW("can't release the semaphore more than its maximum value: ", _max_value);
  }

  ++_cur_value;
  
  if(dst.empty()) {
    dst.swap(_waiters);
  }
  else {
    dst.reserve(dst.size() + _waiters.size());
    dst.insert(dst.end(), _waiters.begin(), _waiters.end());
    _waiters.clear();
  }
}